

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_v4dwt_interleave_v
               (opj_v4dwt_t *dwt,OPJ_FLOAT32 *a,OPJ_UINT32 width,OPJ_UINT32 nb_elts_read)

{
  int iVar1;
  uint uVar2;
  opj_v4_t *poVar3;
  uint local_2c;
  OPJ_UINT32 i;
  opj_v4_t *bi;
  OPJ_UINT32 nb_elts_read_local;
  OPJ_UINT32 width_local;
  OPJ_FLOAT32 *a_local;
  opj_v4dwt_t *dwt_local;
  
  poVar3 = dwt->wavelet;
  iVar1 = dwt->cas;
  for (local_2c = dwt->win_l_x0; local_2c < dwt->win_l_x1; local_2c = local_2c + 1) {
    memcpy(poVar3 + (long)iVar1 + (ulong)(local_2c << 1),a + (ulong)local_2c * (ulong)width,
           (ulong)nb_elts_read << 2);
  }
  uVar2 = dwt->sn;
  poVar3 = dwt->wavelet;
  iVar1 = dwt->cas;
  for (local_2c = dwt->win_h_x0; local_2c < dwt->win_h_x1; local_2c = local_2c + 1) {
    memcpy(poVar3 + (((ulong)(local_2c << 1) + 1) - (long)iVar1),
           a + (ulong)uVar2 * (ulong)width + (ulong)local_2c * (ulong)width,(ulong)nb_elts_read << 2
          );
  }
  return;
}

Assistant:

static void opj_v4dwt_interleave_v(opj_v4dwt_t* OPJ_RESTRICT dwt,
                                   OPJ_FLOAT32* OPJ_RESTRICT a,
                                   OPJ_UINT32 width,
                                   OPJ_UINT32 nb_elts_read)
{
    opj_v4_t* OPJ_RESTRICT bi = dwt->wavelet + dwt->cas;
    OPJ_UINT32 i;

    for (i = dwt->win_l_x0; i < dwt->win_l_x1; ++i) {
        memcpy(&bi[i * 2], &a[i * (OPJ_SIZE_T)width],
               (OPJ_SIZE_T)nb_elts_read * sizeof(OPJ_FLOAT32));
    }

    a += (OPJ_UINT32)dwt->sn * (OPJ_SIZE_T)width;
    bi = dwt->wavelet + 1 - dwt->cas;

    for (i = dwt->win_h_x0; i < dwt->win_h_x1; ++i) {
        memcpy(&bi[i * 2], &a[i * (OPJ_SIZE_T)width],
               (OPJ_SIZE_T)nb_elts_read * sizeof(OPJ_FLOAT32));
    }
}